

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O3

void __thiscall SVGChart::DummyData::DummyData(DummyData *this,long inSize)

{
  iterator __position;
  long lVar1;
  float local_2c;
  
  (this->super_PlotDataBase)._vptr_PlotDataBase = (_func_int **)&PTR__DummyData_00112758;
  (this->mRealPlotData).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mRealPlotData).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mRealPlotData).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < inSize) {
    lVar1 = 0;
    do {
      local_2c = (float)(int)lVar1;
      __position._M_current =
           (this->mRealPlotData).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->mRealPlotData).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  (&this->mRealPlotData,__position,&local_2c);
      }
      else {
        *__position._M_current = local_2c;
        (this->mRealPlotData).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      lVar1 = lVar1 + 1;
    } while (inSize != lVar1);
  }
  return;
}

Assistant:

DummyData::DummyData (long inSize) {
      for (int theI=0;theI<inSize;theI++) {
        mRealPlotData.push_back (theI);// simple ascending data
      }
    }